

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.h
# Opt level: O0

void PrintHelp(void)

{
  ProgramArgs defaults;
  ProgramArgs local_20;
  
  SetDefaultArgs(&local_20);
  fprintf(_stderr,
          "ark_harmonic_symplectic: an ARKODE example demonstrating the SPRKStep time-stepping module solving a simple harmonic oscillator\n"
         );
  fprintf(_stderr,"  --order <int>               the order of the method to use (default %d)\n",
          (ulong)(uint)local_20.order);
  fprintf(_stderr,"  --dt <Real>                 the fixed-time step size to use (default %.1Le)\n")
  ;
  fprintf(_stderr,"  --nout <int>                the number of output times (default %d)\n",
          (ulong)(uint)local_20.num_output_times);
  fprintf(_stderr,
          "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
         );
  fprintf(_stderr,"  --disable-tstop             turns off tstop mode\n");
  return;
}

Assistant:

static void PrintHelp(void)
{
  ProgramArgs defaults;
  SetDefaultArgs(&defaults);
  fprintf(stderr, "ark_harmonic_symplectic: an ARKODE example demonstrating "
                  "the SPRKStep time-stepping module solving a simple harmonic "
                  "oscillator\n");
  /* clang-format off */
  fprintf(stderr, "  --order <int>               the order of the method to use (default %d)\n",
    defaults.order);
  fprintf(stderr, "  --dt <Real>                 the fixed-time step size to use (default %.1Le)\n",
    (long double)defaults.dt);
  fprintf(stderr, "  --nout <int>                the number of output times (default %d)\n",
    defaults.num_output_times);
  fprintf(stderr, "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n");
  fprintf(stderr, "  --disable-tstop             turns off tstop mode\n");
  /* clang-format on */
}